

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::write_decimal<int>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,int value)

{
  checked_ptr<typename_buffer<wchar_t>::value_type> pwVar1;
  wchar_t *pwVar2;
  uint in_ESI;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *in_RDI;
  checked_ptr<typename_buffer<wchar_t>::value_type> *it;
  int num_digits;
  bool negative;
  uint32_or_64_or_128_t<int> abs_value;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  checked_ptr<typename_buffer<wchar_t>::value_type> local_28;
  checked_ptr<typename_buffer<wchar_t>::value_type> *local_20;
  int local_18;
  byte local_11;
  uint local_10;
  
  local_10 = in_ESI;
  local_11 = is_negative<int,_0>(in_ESI);
  if ((bool)local_11) {
    local_10 = (local_10 ^ 0xffffffff) + 1;
  }
  local_18 = count_digits(local_10);
  pwVar1 = reserve(in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  local_20 = &local_28;
  local_28 = pwVar1;
  if ((local_11 & 1) != 0) {
    local_28 = pwVar1 + 1;
    *pwVar1 = L'-';
  }
  pwVar2 = format_decimal<wchar_t,wchar_t*,unsigned_int>
                     ((wchar_t *)in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  *local_20 = pwVar2;
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }